

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O1

void __thiscall cppmetrics::ScheduledReporter::loop_while_running(ScheduledReporter *this)

{
  cv_status cVar1;
  long lVar2;
  unique_lock<std::mutex> lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  next_report_time;
  unique_lock<std::mutex> local_48;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  do {
    lVar2 = std::chrono::_V2::system_clock::now();
    local_38.__d.__r = (duration)(lVar2 + (this->m_interval).__r);
    local_48._M_owns = false;
    local_48._M_device = &this->m_mutex;
    std::unique_lock<std::mutex>::lock(&local_48);
    local_48._M_owns = true;
    if (this->m_is_running == true) {
      do {
        lVar2 = std::chrono::_V2::system_clock::now();
        if ((long)local_38.__d.__r <= lVar2) break;
        do {
          if (this->m_is_running != true) break;
          cVar1 = std::condition_variable::
                  __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            (&this->m_cv,&local_48,&local_38);
        } while (cVar1 != timeout);
      } while (this->m_is_running != false);
    }
    if (this->m_is_running != true) {
      std::unique_lock<std::mutex>::~unique_lock(&local_48);
      return;
    }
    std::unique_lock<std::mutex>::unlock(&local_48);
    (*(this->super_Reporter)._vptr_Reporter[2])(this);
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
  } while( true );
}

Assistant:

void ScheduledReporter::loop_while_running()
{
  while (true)
  {
    auto start = std::chrono::system_clock::now();
    auto next_report_time = start + m_interval;

    std::unique_lock<std::mutex> lock(m_mutex);

    while (m_is_running && next_report_time > std::chrono::system_clock::now())
    {
      m_cv.wait_until(lock, next_report_time, [&]() {
        // Predicate returns 'false' if waiting should continue.
        // We want to stop waiting if we have ceased running,
        // and to continue waiting while we are running.
        return !m_is_running;
      });
    }

    if (!m_is_running)
    {
      return;
    }

    lock.unlock();
    report();
  }
}